

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O3

void __thiscall hwnet::util::TimerMgr::up(TimerMgr *this,size_t idx)

{
  Timer *pTVar1;
  bool bVar2;
  ulong uVar3;
  pointer ppTVar4;
  
  if (1 < idx) {
    ppTVar4 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar3 = idx >> 1;
      pTVar1 = ppTVar4[idx - 1];
      if (ppTVar4[uVar3 - 1]->mExpiredTime <= pTVar1->mExpiredTime) {
        return;
      }
      ppTVar4[idx - 1] = ppTVar4[uVar3 - 1];
      (this->elements).
      super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3 - 1] = pTVar1;
      ppTVar4 = (this->elements).
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar4[idx - 1]->mIndex = idx;
      ppTVar4[uVar3 - 1]->mIndex = uVar3;
      bVar2 = 3 < idx;
      idx = uVar3;
    } while (bVar2);
  }
  return;
}

Assistant:

void up(size_t idx) {
		auto p = parent(idx);
		while(p > 0) {
			auto offsetIdx = getOffset(idx);
			auto offsetP = getOffset(p);
			if(this->elements[offsetIdx]->mExpiredTime < this->elements[offsetP]->mExpiredTime) {
				this->swap(idx,p);
				idx = p;
				p = parent(idx);
			} else {
				break;
			}
		}
	}